

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_ipairs(lua_State *L)

{
  lua_State *L_local;
  
  luaL_checktype(L,1,5);
  lua_pushvalue(L,-0x2713);
  lua_pushvalue(L,1);
  lua_pushinteger(L,0);
  return 3;
}

Assistant:

static int luaB_ipairs(lua_State*L){
luaL_checktype(L,1,5);
lua_pushvalue(L,lua_upvalueindex(1));
lua_pushvalue(L,1);
lua_pushinteger(L,0);
return 3;
}